

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<char,_std::allocator<char>_> *this,
          basic_json_decode_options<char> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  allocator *in_RCX;
  basic_json_decode_options<char> *in_RSI;
  ser_context *in_RDI;
  size_t initial_stack_capacity;
  basic_json_options_common<char> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  int local_13c;
  int in_stack_fffffffffffffec8;
  vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *this_00;
  string local_a8 [32];
  double local_88;
  string local_80 [32];
  double local_60;
  string local_58 [32];
  long local_38;
  allocator *local_20;
  basic_json_decode_options<char> *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_json_parser_013334e8;
  iVar4 = basic_json_options_common<char>::max_nesting_depth
                    ((basic_json_options_common<char> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  *(int *)&in_RDI[1]._vptr_ser_context = iVar4;
  bVar1 = basic_json_decode_options<char>::allow_trailing_comma(local_10);
  *(bool *)((long)&in_RDI[1]._vptr_ser_context + 4) = bVar1;
  bVar1 = basic_json_decode_options<char>::allow_comments(local_10);
  *(bool *)((long)&in_RDI[1]._vptr_ser_context + 5) = bVar1;
  bVar1 = basic_json_decode_options<char>::lossless_number(local_10);
  *(bool *)((long)&in_RDI[1]._vptr_ser_context + 6) = bVar1;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
             in_stack_fffffffffffffea8);
  *(undefined4 *)&in_RDI[6]._vptr_ser_context = 0;
  *(undefined4 *)((long)&in_RDI[6]._vptr_ser_context + 4) = 0;
  *(undefined4 *)&in_RDI[7]._vptr_ser_context = 0;
  in_RDI[8]._vptr_ser_context = (_func_int **)0x1;
  in_RDI[9]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[10]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xb]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xc]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xd]._vptr_ser_context = (_func_int **)0x0;
  in_RDI[0xe]._vptr_ser_context = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0xf]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 3) = 1;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0xf]._vptr_ser_context + 5) = 0;
  *(undefined4 *)&in_RDI[0x10]._vptr_ser_context = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x11),local_20);
  detail::chars_to::chars_to
            ((chars_to *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  this_00 = (vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *)(in_RDI + 0x19)
  ;
  std::allocator<jsoncons::parse_state>::allocator<char>
            ((allocator<jsoncons::parse_state> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (allocator<char> *)in_stack_fffffffffffffe98);
  std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::vector
            ((vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (allocator_type *)in_stack_fffffffffffffe98);
  std::allocator<jsoncons::parse_state>::~allocator((allocator<jsoncons::parse_state> *)0x1d460c);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
            *)0x1d4625);
  std::__cxx11::string::reserve((ulong)(in_RDI + 0x11));
  iVar4 = basic_json_options_common<char>::max_nesting_depth
                    ((basic_json_options_common<char> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if (iVar4 < 0x41) {
    in_stack_fffffffffffffec8 =
         basic_json_options_common<char>::max_nesting_depth
                   ((basic_json_options_common<char> *)
                    ((long)&local_10->_vptr_basic_json_decode_options +
                    (long)local_10->_vptr_basic_json_decode_options[-3]));
    local_13c = in_stack_fffffffffffffec8 + 2;
  }
  else {
    local_13c = 0x42;
  }
  local_38 = (long)local_13c;
  std::vector<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>::reserve
            (this_00,CONCAT44(iVar4,in_stack_fffffffffffffec8));
  push_state((basic_json_parser<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (parse_state)((ulong)in_stack_fffffffffffffe98 >> 0x38));
  bVar1 = basic_json_options_common<char>::enable_str_to_nan
                    ((basic_json_options_common<char> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if (bVar1) {
    basic_json_options_common<char>::nan_to_str_abi_cxx11_(in_stack_fffffffffffffe98);
    local_60 = nan("");
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,
               (double *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    std::__cxx11::string::~string(local_58);
  }
  uVar2 = basic_json_options_common<char>::enable_str_to_inf
                    ((basic_json_options_common<char> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if ((bool)uVar2) {
    in_stack_fffffffffffffea8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x1c);
    basic_json_options_common<char>::inf_to_str_abi_cxx11_(in_stack_fffffffffffffe98);
    local_88 = std::numeric_limits<double>::infinity();
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8,
               (double *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    std::__cxx11::string::~string(local_80);
  }
  uVar3 = basic_json_options_common<char>::enable_str_to_neginf
                    ((basic_json_options_common<char> *)
                     ((long)&local_10->_vptr_basic_json_decode_options +
                     (long)local_10->_vptr_basic_json_decode_options[-3]));
  if ((bool)uVar3) {
    basic_json_options_common<char>::neginf_to_str_abi_cxx11_
              ((basic_json_options_common<char> *)CONCAT44(iVar4,in_stack_fffffffffffffec8));
    std::numeric_limits<double>::infinity();
    std::
    vector<std::pair<std::__cxx11::string,double>,std::allocator<std::pair<std::__cxx11::string,double>>>
    ::emplace_back<std::__cxx11::string,double>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8,
               (double *)CONCAT17(uVar3,in_stack_fffffffffffffea0));
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

basic_json_parser(const basic_json_decode_options<char_type>& options,
                      std::function<bool(json_errc,const ser_context&)> err_handler, 
                      const TempAllocator& temp_alloc = TempAllocator())
       : max_nesting_depth_(options.max_nesting_depth()),
         allow_trailing_comma_(options.allow_trailing_comma()),
         allow_comments_(options.allow_comments()),
         lossless_number_(options.lossless_number()),
         err_handler_(err_handler),
         string_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        string_buffer_.reserve(initial_string_buffer_capacity);

        std::size_t initial_stack_capacity = options.max_nesting_depth() <= (default_initial_stack_capacity-2) ? (options.max_nesting_depth()+2) : default_initial_stack_capacity;
        state_stack_.reserve(initial_stack_capacity );
        push_state(parse_state::root);

        if (options.enable_str_to_nan())
        {
            string_double_map_.emplace_back(options.nan_to_str(),std::nan(""));
        }
        if (options.enable_str_to_inf())
        {
            string_double_map_.emplace_back(options.inf_to_str(),std::numeric_limits<double>::infinity());
        }
        if (options.enable_str_to_neginf())
        {
            string_double_map_.emplace_back(options.neginf_to_str(),-std::numeric_limits<double>::infinity());
        }
    }